

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::
add_face_texcoords(ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,
                  FaceHandle _fh,VertexHandle _vh,
                  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
                  *_face_texcoords)

{
  long lVar1;
  pointer pVVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  lVar1 = *(long *)&(this->mesh_->super_Mesh).
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                    .super_PolyConnectivity.field_0xe0;
  uVar6 = *(uint *)(*(long *)&(this->mesh_->super_Mesh).
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                              .super_PolyConnectivity.field_0xf8 +
                   (long)(int)_fh.super_BaseHandle.idx_ * 4);
  iVar3 = (int)uVar6 >> 1;
  uVar4 = uVar6 & 1;
  while( true ) {
    lVar5 = (long)((int)uVar6 >> 1) * 0x20 + lVar1;
    if (((BaseHandle)*(int *)((ulong)((uVar6 & 1) << 4) + 4 + lVar5) == _vh.super_BaseHandle.idx_)
       || (uVar6 == *(uint *)((ulong)(uVar4 << 4) + 0xc + (long)iVar3 * 0x20 + lVar1))) break;
    uVar6 = *(uint *)(lVar5 + 8 + (ulong)((uVar6 & 1) << 4));
  }
  uVar4 = 0;
  while( true ) {
    pVVar2 = (_face_texcoords->
             super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(_face_texcoords->
                      super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 3) <=
        (ulong)uVar4) break;
    (*(this->super_BaseImporter)._vptr_BaseImporter[0x15])(this,(ulong)uVar6,pVVar2 + uVar4);
    uVar6 = *(uint *)((ulong)((uVar6 & 1) << 4) + 8 +
                     (long)((int)uVar6 >> 1) * 0x20 +
                     *(long *)&(this->mesh_->super_Mesh).
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                               .super_PolyConnectivity.field_0xe0);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

virtual void add_face_texcoords( FaceHandle _fh, VertexHandle _vh, const std::vector<Vec2f>& _face_texcoords) override
  {
    // get first halfedge handle
    HalfedgeHandle cur_heh   = mesh_.halfedge_handle(_fh);
    HalfedgeHandle end_heh   = mesh_.prev_halfedge_handle(cur_heh);

    // find start heh
    while( mesh_.to_vertex_handle(cur_heh) != _vh && cur_heh != end_heh )
      cur_heh = mesh_.next_halfedge_handle( cur_heh);

    for(unsigned int i=0; i<_face_texcoords.size(); ++i)
    {
      set_texcoord( cur_heh, _face_texcoords[i]);
      cur_heh = mesh_.next_halfedge_handle( cur_heh);
    }
  }